

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>>::
emplaceRealloc<std::basic_string_view<char,std::char_traits<char>>>
          (SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>> *this,pointer pos,
          basic_string_view<char,_std::char_traits<char>_> *args)

{
  size_type sVar1;
  size_type sVar2;
  size_type capacity;
  iterator pbVar3;
  basic_string_view<char,_std::char_traits<char>_> *__result;
  basic_string_view<char,_std::char_traits<char>_> *pbVar4;
  iterator __first;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  basic_string_view<char,_std::char_traits<char>_> *args_local;
  pointer pos_local;
  SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_> *this_local;
  
  sVar1 = *(size_type *)(this + 8);
  sVar2 = SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::max_size
                    ((SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_> *)this
                    );
  if (sVar1 == sVar2) {
    slang::detail::throwLengthError();
  }
  capacity = SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::
             calculateGrowth((SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>
                              *)this,*(long *)(this + 8) + 1);
  pbVar3 = SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::begin
                     ((SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                      this);
  __result = (basic_string_view<char,_std::char_traits<char>_> *)
             slang::detail::allocArray(capacity,0x10);
  pbVar4 = __result + ((long)pos - (long)pbVar3 >> 4);
  pbVar4->_M_len = args->_M_len;
  pbVar4->_M_str = args->_M_str;
  pbVar3 = SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::end
                     ((SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                      this);
  if (pos == pbVar3) {
    __first = SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::begin
                        ((SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                         this);
    pbVar3 = SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::end
                       ((SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                        this);
    std::
    uninitialized_move<std::basic_string_view<char,std::char_traits<char>>*,std::basic_string_view<char,std::char_traits<char>>*>
              (__first,pbVar3,__result);
  }
  else {
    pbVar3 = SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::begin
                       ((SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                        this);
    std::
    uninitialized_move<std::basic_string_view<char,std::char_traits<char>>*,std::basic_string_view<char,std::char_traits<char>>*>
              (pbVar3,pos,__result);
    pbVar3 = SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::end
                       ((SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                        this);
    std::
    uninitialized_move<std::basic_string_view<char,std::char_traits<char>>*,std::basic_string_view<char,std::char_traits<char>>*>
              (pos,pbVar3,pbVar4 + 1);
  }
  SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::cleanup
            ((SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_> *)this,
             (EVP_PKEY_CTX *)pbVar3);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(size_type *)(this + 0x10) = capacity;
  *(basic_string_view<char,_std::char_traits<char>_> **)this = __result;
  return pbVar4;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}